

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O1

void Sim_UtilInfoDetectNews(uint *pInfo1,uint *pInfo2,int nWords,Vec_Int_t *vDiffs)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  
  vDiffs->nSize = 0;
  if (0 < nWords) {
    iVar4 = 0;
    uVar3 = 0;
    do {
      uVar1 = pInfo1[uVar3];
      uVar2 = pInfo2[uVar3];
      if ((~uVar1 & uVar2) != 0) {
        uVar5 = 0;
        do {
          if (((~uVar1 & uVar2) >> (uVar5 & 0x1f) & 1) != 0) {
            Vec_IntPush(vDiffs,uVar5 + iVar4);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != 0x20);
      }
      uVar3 = uVar3 + 1;
      iVar4 = iVar4 + 0x20;
    } while (uVar3 != (uint)nWords);
  }
  return;
}

Assistant:

void Sim_UtilInfoDetectNews( unsigned * pInfo1, unsigned * pInfo2, int nWords, Vec_Int_t * vDiffs )
{
    int w, b;
    unsigned uMask;
    vDiffs->nSize = 0;
    for ( w = 0; w < nWords; w++ )
        if ( (uMask = (pInfo2[w] & ~pInfo1[w])) )
            for ( b = 0; b < 32; b++ )
                if ( uMask & (1 << b) )
                    Vec_IntPush( vDiffs, 32*w + b );
}